

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  long lVar1;
  once_flag *__once;
  int iVar2;
  undefined4 extraout_var;
  Symbol SVar4;
  Descriptor *pDVar5;
  long lVar6;
  long lVar7;
  Descriptor *foreign_type;
  FieldDescriptor *this_00;
  Symbol SVar8;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  long lVar3;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  lVar3 = CONCAT44(extraout_var,iVar2);
  SVar4 = LookupSymbolNoPlaceholder
                    (this->builder_,name,(string *)(*(long *)(lVar3 + 8) + 0x20),LOOKUP_ALL,true);
  SVar8.ptr_ = (SymbolBase *)(FieldDescriptor *)0x0;
  if ((SVar4.ptr_ != (SymbolBase *)0x0) && (SVar8 = SVar4, (SVar4.ptr_)->symbol_type_ != '\x02')) {
    if (((SVar4.ptr_)->symbol_type_ == '\x01') &&
       ((*(char *)(*(long *)(lVar3 + 0x20) + 0x48) == '\x01' && (0 < *(int *)(SVar4.ptr_ + 0x7c)))))
    {
      lVar6 = 0;
      lVar7 = 0;
      do {
        lVar1 = *(long *)(SVar4.ptr_ + 0x50);
        if (*(long *)(lVar1 + 0x20 + lVar6) == lVar3) {
          this_00 = (FieldDescriptor *)(lVar1 + lVar6);
          __once = *(once_flag **)(lVar1 + 0x18 + lVar6);
          if (__once != (once_flag *)0x0) {
            local_38 = FieldDescriptor::TypeOnceInit;
            local_40 = this_00;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (__once,&local_38,&local_40);
          }
          if (((*(char *)(lVar1 + 2 + lVar6) == '\v') &&
              ((*(byte *)(lVar1 + 1 + lVar6) & 0x60) == 0x20)) &&
             (pDVar5 = FieldDescriptor::message_type(this_00), pDVar5 == (Descriptor *)SVar4.ptr_))
          {
            return this_00;
          }
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x48;
      } while (lVar7 < *(int *)(SVar4.ptr_ + 0x7c));
    }
    SVar8.ptr_ = (SymbolBase *)(FieldDescriptor *)0x0;
  }
  return (FieldDescriptor *)SVar8.ptr_;
}

Assistant:

const FieldDescriptor* FindExtension(Message* message,
                                       const std::string& name) const override {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result =
        builder_->LookupSymbolNoPlaceholder(name, descriptor->full_name());
    if (auto* field = result.field_descriptor()) {
      return field;
    } else if (result.type() == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor();
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return nullptr;
  }